

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Log::add_logsink(Log *this,log_sink_ptr *sink)

{
  lock_guard<std::recursive_mutex> *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  value_type *in_stack_ffffffffffffffd8;
  vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1ce4bb);
  return;
}

Assistant:

void add_logsink(const log_sink_ptr& sink) {
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    log_sinks_.push_back(sink);
  }